

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O1

int __thiscall QFile::open(QFile *this,char *__file,int __oflag,...)

{
  QFilePrivate *this_00;
  bool bVar1;
  int iVar2;
  __off64_t pos;
  FileHandleFlags in_ECX;
  int __oflag_00;
  int iVar3;
  QFile *__file_00;
  char *pcVar4;
  
  this_00 = (QFilePrivate *)(this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d;
  pcVar4 = __file;
  bVar1 = QIODevice::isOpen((QIODevice *)this);
  iVar3 = (int)pcVar4;
  if (bVar1) {
    file_already_open(this,(char *)0x0);
  }
  else {
    pcVar4 = (char *)(ulong)(__oflag | 2);
    if ((__oflag & 0x44U) == 0) {
      pcVar4 = (char *)(ulong)(uint)__oflag;
    }
    __file_00 = this;
    QFileDevice::unsetError(&this->super_QFileDevice);
    if (((ulong)pcVar4 & 3) == 0) {
      open((char *)__file_00,iVar3);
    }
    else {
      bVar1 = QFilePrivate::openExternalFile
                        (this_00,(OpenMode)((uint)pcVar4 | 0x20),(FILE *)__file,in_ECX);
      if (bVar1) {
        QIODevice::open((QIODevice *)this,pcVar4,__oflag_00);
        iVar3 = (int)CONCAT71((int7)((ulong)this_00 >> 8),1);
        if (((ulong)pcVar4 & 4) != 0) {
          return iVar3;
        }
        iVar2 = (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xc])(this);
        if ((char)iVar2 == '\0') {
          pos = ftello64((FILE *)__file);
          if (pos != -1) {
            QIODevice::seek((QIODevice *)this,pos);
            return iVar3;
          }
          return iVar3;
        }
        return iVar3;
      }
    }
  }
  return 0;
}

Assistant:

bool QFile::open(FILE *fh, OpenMode mode, FileHandleFlags handleFlags)
{
    Q_D(QFile);
    if (isOpen())
        return file_already_open(*this);
    // Either Append or NewOnly implies WriteOnly
    if (mode & (Append | NewOnly))
        mode |= WriteOnly;
    unsetError();
    if ((mode & (ReadOnly | WriteOnly)) == 0) {
        qWarning("QFile::open: File access not specified");
        return false;
    }

    // QIODevice provides the buffering, so request unbuffered file engines
    if (d->openExternalFile(mode | Unbuffered, fh, handleFlags)) {
        QIODevice::open(mode);
        if (!(mode & Append) && !isSequential()) {
            qint64 pos = (qint64)QT_FTELL(fh);
            if (pos != -1) {
                // Skip redundant checks in QFileDevice::seek().
                QIODevice::seek(pos);
            }
        }
        return true;
    }
    return false;
}